

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

int __thiscall bdQuery::printQuery(bdQuery *this)

{
  bdDhtFunctions *pbVar1;
  FILE *pFVar2;
  iterator iVar3;
  bool bVar4;
  uint uVar5;
  pointer pbVar6;
  pointer ppVar7;
  _Self local_68;
  _List_node_base *local_60;
  _List_node_base *local_58;
  _Self local_50;
  _List_node_base *local_48;
  _List_iterator<bdPeer> local_40;
  iterator lit;
  _Self local_28;
  _Self local_20;
  iterator it;
  time_t ts;
  bdQuery *this_local;
  
  it._M_node = (_Base_ptr)time((time_t *)0x0);
  fprintf(_stderr,"Query for: ");
  (*this->mFns->_vptr_bdDhtFunctions[0xb])(this->mFns,&std::cerr);
  fprintf(_stderr," Query State: %d",(ulong)this->mState);
  fprintf(_stderr," Query Age %ld secs",(long)it._M_node - this->mQueryTS);
  if (2 < this->mState) {
    fprintf(_stderr," Search Time: %d secs",(ulong)(uint)this->mSearchTime);
  }
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Closest Available Peer: ");
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
       ::begin(&this->mClosest);
  local_28._M_node =
       (_Base_ptr)
       std::
       multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
       ::end(&this->mClosest);
  bVar4 = std::operator!=(&local_20,&local_28);
  if (bVar4) {
    pbVar1 = this->mFns;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    (*pbVar1->_vptr_bdDhtFunctions[10])(pbVar1,&std::cerr,&ppVar7->second);
    pFVar2 = _stderr;
    pbVar1 = this->mFns;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    uVar5 = (*pbVar1->_vptr_bdDhtFunctions[6])(pbVar1,ppVar7);
    fprintf(pFVar2,"  Bucket: %d ",(ulong)uVar5);
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Flags: %x",(ulong)(ppVar7->second).mPeerFlags);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Found: %ld ago",(long)iVar3._M_node - (ppVar7->second).mFoundTime);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," LastSent: %ld ago",(long)iVar3._M_node - (ppVar7->second).mLastSendTime);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," LastRecv: %ld ago",(long)iVar3._M_node - (ppVar7->second).mLastRecvTime);
  }
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Closest Potential Peer: ");
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
       ::begin(&this->mPotentialPeers);
  lit._M_node = (_List_node_base *)
                std::
                multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                ::end(&this->mPotentialPeers);
  bVar4 = std::operator!=(&local_20,(_Self *)&lit);
  if (bVar4) {
    pbVar1 = this->mFns;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    (*pbVar1->_vptr_bdDhtFunctions[10])(pbVar1,&std::cerr,&ppVar7->second);
    pFVar2 = _stderr;
    pbVar1 = this->mFns;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    uVar5 = (*pbVar1->_vptr_bdDhtFunctions[6])(pbVar1,ppVar7);
    fprintf(pFVar2,"  Bucket: %d ",(ulong)uVar5);
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Flags: %x",(ulong)(ppVar7->second).mPeerFlags);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Found: %ld ago",(long)iVar3._M_node - (ppVar7->second).mFoundTime);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," LastSent: %ld ago",(long)iVar3._M_node - (ppVar7->second).mLastSendTime);
    iVar3 = it;
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," LastRecv: %ld ago",(long)iVar3._M_node - (ppVar7->second).mLastRecvTime);
  }
  fprintf(_stderr,"\n");
  std::_List_iterator<bdPeer>::_List_iterator(&local_40);
  fprintf(_stderr,"Flagged Proxies:\n");
  local_48 = (_List_node_base *)
             std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(&this->mProxiesFlagged);
  local_40._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(&this->mProxiesFlagged);
    bVar4 = std::operator!=(&local_40,&local_50);
    if (!bVar4) break;
    fprintf(_stderr,"ProxyId:  ");
    pbVar1 = this->mFns;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    (*pbVar1->_vptr_bdDhtFunctions[10])(pbVar1,&std::cerr,pbVar6);
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Flags: %x",(ulong)(ppVar7->second).mPeerFlags);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," Found: %ld ago",(long)iVar3._M_node - pbVar6->mFoundTime);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," LastSent: %ld ago",(long)iVar3._M_node - pbVar6->mLastSendTime);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," LastRecv: %ld ago",(long)iVar3._M_node - pbVar6->mLastRecvTime);
    fprintf(_stderr,"\n");
    local_58 = (_List_node_base *)std::_List_iterator<bdPeer>::operator++(&local_40,0);
  }
  fprintf(_stderr,"Potential Proxies:\n");
  local_60 = (_List_node_base *)
             std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::begin(&this->mProxiesUnknown);
  local_40._M_node = local_60;
  while( true ) {
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::end(&this->mProxiesUnknown);
    bVar4 = std::operator!=(&local_40,&local_68);
    if (!bVar4) break;
    fprintf(_stderr,"ProxyId:  ");
    pbVar1 = this->mFns;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    (*pbVar1->_vptr_bdDhtFunctions[10])(pbVar1,&std::cerr,pbVar6);
    pFVar2 = _stderr;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&local_20);
    fprintf(pFVar2," Flags: %x",(ulong)(ppVar7->second).mPeerFlags);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," Found: %ld ago",(long)iVar3._M_node - pbVar6->mFoundTime);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," LastSent: %ld ago",(long)iVar3._M_node - pbVar6->mLastSendTime);
    iVar3 = it;
    pFVar2 = _stderr;
    pbVar6 = std::_List_iterator<bdPeer>::operator->(&local_40);
    fprintf(pFVar2," LastRecv: %ld ago",(long)iVar3._M_node - pbVar6->mLastRecvTime);
    fprintf(_stderr,"\n");
    std::_List_iterator<bdPeer>::operator++(&local_40,0);
  }
  return 1;
}

Assistant:

int bdQuery::printQuery() {
#ifdef DEBUG_QUERY 
	fprintf(stderr, "bdQuery::printQuery()\n");
#endif
	
	time_t ts = time(NULL);
	fprintf(stderr, "Query for: ");
	mFns->bdPrintNodeId(std::cerr, &mId);
	fprintf(stderr, " Query State: %d", mState);
	fprintf(stderr, " Query Age %ld secs", ts-mQueryTS);
	if (mState >= BITDHT_QUERY_FAILURE)
		fprintf(stderr, " Search Time: %d secs", mSearchTime);
	fprintf(stderr, "\n");

#ifdef DEBUG_QUERY 
	fprintf(stderr, "Closest Available Peers:\n");
	std::multimap<bdMetric, bdPeer>::iterator it;
	for (it = mClosest.begin(); it != mClosest.end(); it++) {
		fprintf(stderr, "Id:  ");
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
		fprintf(stderr, "\n");
	}

	fprintf(stderr, "\nClosest Potential Peers:\n");
	for (it = mPotentialPeers.begin(); it != mPotentialPeers.end(); it++) {
		fprintf(stderr, "Id:  ");
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
		fprintf(stderr, "\n");
	}
#else
	// shortened version.
	fprintf(stderr, "Closest Available Peer: ");
	std::multimap<bdMetric, bdPeer>::iterator it = mClosest.begin(); 
	if (it != mClosest.end()) {
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
	}
	fprintf(stderr, "\n");

	fprintf(stderr, "Closest Potential Peer: ");
	it = mPotentialPeers.begin(); 
	if (it != mPotentialPeers.end()) {
		mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
		fprintf(stderr, "  Bucket: %d ", mFns->bdBucketDistance(&(it->first)));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-it->second.mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-it->second.mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-it->second.mLastRecvTime);
	}
	fprintf(stderr, "\n");

#endif
	std::list<bdPeer>::iterator lit;
	fprintf(stderr, "Flagged Proxies:\n");
	for (lit = mProxiesFlagged.begin(); lit != mProxiesFlagged.end(); lit++) {
		fprintf(stderr, "ProxyId:  ");
		mFns->bdPrintId(std::cerr, &(lit->mPeerId));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-lit->mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-lit->mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-lit->mLastRecvTime);
		fprintf(stderr, "\n");
	}
	
	fprintf(stderr, "Potential Proxies:\n");
	for (lit = mProxiesUnknown.begin(); lit != mProxiesUnknown.end(); lit++) {
		fprintf(stderr, "ProxyId:  ");
		mFns->bdPrintId(std::cerr, &(lit->mPeerId));
		fprintf(stderr," Flags: %x", it->second.mPeerFlags);
		fprintf(stderr," Found: %ld ago", ts-lit->mFoundTime);
		fprintf(stderr," LastSent: %ld ago", ts-lit->mLastSendTime);
		fprintf(stderr," LastRecv: %ld ago", ts-lit->mLastRecvTime);
		fprintf(stderr, "\n");
	}

	return 1;
}